

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O1

double __thiscall BMRS_XZ<RemSP>::Get_RunAllocTime(BMRS_XZ<RemSP> *this)

{
  double dVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  
  lVar2 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar2;
  lVar2 = cv::getTickCount();
  dVar3 = (double)lVar2 -
          (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar3;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar3;
  dVar1 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  lVar2 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar2;
  lVar2 = cv::getTickCount();
  dVar4 = (double)lVar2 -
          (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar4;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar4;
  return (dVar3 * 1000.0) / dVar1 -
         (dVar4 * 1000.0) /
         (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
}

Assistant:

double Get_RunAllocTime() {
        Run* run_start = data_runs.runs;
        Run* run_end = run_start;
        for (size_t i = 0; i < data_runs.height; i++, run_end++) {
            for (; run_end->start_pos != 0xFFFF; run_end++);
        }
        size_t size_used = (size_t)run_end - (size_t)run_start;

        Runs runs_temp;
        perf_.start();
        runs_temp.Alloc(data_runs.height, data_runs.width);
        memset(runs_temp.runs, 0, size_used);
        perf_.stop();
        double t = perf_.last();

        perf_.start();
        memset(runs_temp.runs, 0, size_used);
        perf_.stop();
        double t_result = t - perf_.last();

        runs_temp.Dealloc();
        return t_result;
    }